

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_hdr.c
# Opt level: O0

void write_linked_location(CURL *curl,char *location,size_t loclen,FILE *stream)

{
  int iVar1;
  char *__nptr;
  long lVar2;
  bool bVar3;
  long vvn;
  char *vver;
  size_t sStack_60;
  int space_skipped;
  size_t llen;
  char *loc;
  char *finalurl;
  char *scheme;
  char *locurl;
  char *copyloc;
  CURLU *u;
  FILE *stream_local;
  size_t loclen_local;
  char *location_local;
  CURL *curl_local;
  
  copyloc = (char *)0x0;
  locurl = (char *)0x0;
  scheme = (char *)0x0;
  finalurl = (char *)0x0;
  loc = (char *)0x0;
  vver._4_4_ = 0;
  u = (CURLU *)stream;
  stream_local = (FILE *)loclen;
  loclen_local = (size_t)location;
  location_local = (char *)curl;
  __nptr = getenv("VTE_VERSION");
  sStack_60 = loclen;
  llen = (size_t)location;
  if (((__nptr == (char *)0x0) || (lVar2 = strtol(__nptr,(char **)0x0,10), lVar2 < 1)) ||
     (0x12c1 < lVar2)) {
    while( true ) {
      bVar3 = false;
      if ((sStack_60 != 0) && (bVar3 = true, *(char *)llen != ' ')) {
        bVar3 = *(char *)llen == '\t';
      }
      if (!bVar3) break;
      llen = llen + 1;
      sStack_60 = sStack_60 - 1;
      vver._4_4_ = vver._4_4_ + 1;
    }
    while( true ) {
      bVar3 = false;
      if ((sStack_60 != 0) && (bVar3 = true, *(char *)(llen + (sStack_60 - 1)) != '\n')) {
        bVar3 = *(char *)(llen + (sStack_60 - 1)) == '\r';
      }
      if (!bVar3) break;
      sStack_60 = sStack_60 - 1;
    }
    copyloc = (char *)curl_url();
    if ((copyloc != (char *)0x0) && (locurl = (char *)malloc(sStack_60 + 1), locurl != (char *)0x0))
    {
      memcpy(locurl,(void *)llen,sStack_60);
      locurl[sStack_60] = '\0';
      iVar1 = curl_easy_getinfo(location_local,0x100001,&scheme);
      if (((iVar1 == 0) &&
          ((((iVar1 = curl_url_set(copyloc,0,scheme), iVar1 == 0 &&
             (iVar1 = curl_url_set(copyloc,0,locurl), iVar1 == 0)) &&
            (iVar1 = curl_url_get(copyloc,0,&loc,2), iVar1 == 0)) &&
           (iVar1 = curl_url_get(copyloc,1,&finalurl,0), iVar1 == 0)))) &&
         ((((iVar1 = strcmp("http",finalurl), iVar1 == 0 ||
            (iVar1 = strcmp("https",finalurl), iVar1 == 0)) ||
           (iVar1 = strcmp("ftp",finalurl), iVar1 == 0)) ||
          (iVar1 = strcmp("ftps",finalurl), iVar1 == 0)))) {
        curl_mfprintf(u,"%.*s\x1b]8;;%s\x1b\\%.*s\x1b]8;;\x1b\\",vver._4_4_,loclen_local,loc,
                      (int)stream_local - vver._4_4_,llen);
        goto LAB_0010c38c;
      }
    }
  }
  fwrite((void *)loclen_local,(size_t)stream_local,1,(FILE *)u);
LAB_0010c38c:
  if (copyloc != (char *)0x0) {
    curl_free(loc);
    curl_free(finalurl);
    curl_url_cleanup(copyloc);
    free(locurl);
  }
  return;
}

Assistant:

static
void write_linked_location(CURL *curl, const char *location, size_t loclen,
                           FILE *stream) {
  /* This would so simple if CURLINFO_REDIRECT_URL were available here */
  CURLU *u = NULL;
  char *copyloc = NULL, *locurl = NULL, *scheme = NULL, *finalurl = NULL;
  const char *loc = location;
  size_t llen = loclen;
  int space_skipped = 0;
  char *vver = getenv("VTE_VERSION");

  if(vver) {
    long vvn = strtol(vver, NULL, 10);
    /* Skip formatting for old versions of VTE <= 0.48.1 (Mar 2017) since some
       of those versions have formatting bugs. (#10428) */
    if(0 < vvn && vvn <= 4801)
      goto locout;
  }

  /* Strip leading whitespace of the redirect URL */
  while(llen && (*loc == ' ' || *loc == '\t')) {
    ++loc;
    --llen;
    ++space_skipped;
  }

  /* Strip the trailing end-of-line characters, normally "\r\n" */
  while(llen && (loc[llen-1] == '\n' || loc[llen-1] == '\r'))
    --llen;

  /* CURLU makes it easy to handle the relative URL case */
  u = curl_url();
  if(!u)
    goto locout;

  /* Create a NUL-terminated and whitespace-stripped copy of Location: */
  copyloc = malloc(llen + 1);
  if(!copyloc)
    goto locout;
  memcpy(copyloc, loc, llen);
  copyloc[llen] = 0;

  /* The original URL to use as a base for a relative redirect URL */
  if(curl_easy_getinfo(curl, CURLINFO_EFFECTIVE_URL, &locurl))
    goto locout;
  if(curl_url_set(u, CURLUPART_URL, locurl, 0))
    goto locout;

  /* Redirected location. This can be either absolute or relative. */
  if(curl_url_set(u, CURLUPART_URL, copyloc, 0))
    goto locout;

  if(curl_url_get(u, CURLUPART_URL, &finalurl, CURLU_NO_DEFAULT_PORT))
    goto locout;

  if(curl_url_get(u, CURLUPART_SCHEME, &scheme, 0))
    goto locout;

  if(!strcmp("http", scheme) ||
     !strcmp("https", scheme) ||
     !strcmp("ftp", scheme) ||
     !strcmp("ftps", scheme)) {
    fprintf(stream, "%.*s" LINK "%s" LINKST "%.*s" LINKOFF,
            space_skipped, location,
            finalurl,
            (int)loclen - space_skipped, loc);
    goto locdone;
  }

  /* Not a "safe" URL: do not linkify it */

locout:
  /* Write the normal output in case of error or unsafe */
  fwrite(location, loclen, 1, stream);

locdone:
  if(u) {
    curl_free(finalurl);
    curl_free(scheme);
    curl_url_cleanup(u);
    free(copyloc);
  }
}